

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rr_cache.hpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
cappuccino::
rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::do_find(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *__return_storage_ptr__,
         rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
         *this,unsigned_long *key)

{
  iterator iVar1;
  
  iVar1 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->m_keyed_elements)._M_h,key);
  if (iVar1.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur
      == (__node_type *)0x0) {
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
  }
  else {
    std::_Optional_payload_base<std::__cxx11::string>::_Optional_payload_base<std::__cxx11::string&>
              ((_Optional_payload_base<std::__cxx11::string> *)__return_storage_ptr__,
               &(this->m_elements).
                super__Vector_base<cappuccino::rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
                ._M_impl.super__Vector_impl_data._M_start
                [*(long *)((long)iVar1.
                                 super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                 ._M_cur + 0x10)].m_value);
  }
  return __return_storage_ptr__;
}

Assistant:

auto do_find(const key_type& key) -> std::optional<value_type>
    {
        auto keyed_position = m_keyed_elements.find(key);
        if (keyed_position != m_keyed_elements.end())
        {
            size_t   element_idx = keyed_position->second;
            element& e           = m_elements[element_idx];
            return {e.m_value};
        }

        return {};
    }